

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_solver.cpp
# Opt level: O0

void test_3(string *out_dir)

{
  ChStreamOutAscii *pCVar1;
  undefined1 local_928 [8];
  ChVectorDynamic<double> mx;
  ChSolverMINRES solver;
  ChSolver local_900 [160];
  ChMatrixRef local_860;
  ChMatrixRef local_838;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_810;
  value_type local_7f8;
  value_type local_7f0;
  undefined1 local_7e8 [8];
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvarsb;
  ChKblockGeneric mKb;
  ChMatrixRef local_798;
  NegativeReturnType local_770;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_760;
  undefined1 local_748 [8];
  ChMatrixDynamic<> mtempB;
  undefined1 local_708 [8];
  ChMatrixDynamic<> mtempA;
  value_type local_6d8;
  value_type local_6d0;
  undefined1 local_6c8 [8];
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvarsa;
  ChKblockGeneric mKa;
  ChRowVectorRef local_678;
  ChRowVectorRef local_658;
  ChConstraintTwoBodies local_638 [8];
  ChConstraintTwoBodies mcb;
  ChRowVectorRef local_518;
  ChRowVectorRef local_4f8;
  ChConstraintTwoBodies local_4d8 [8];
  ChConstraintTwoBodies mca;
  ChVectorRef local_3b8;
  undefined1 local_3a0 [8];
  ChVariablesBodyOwnMass mvarC;
  ChVectorRef local_2c0;
  undefined1 local_2a8 [8];
  ChVariablesBodyOwnMass mvarB;
  ChVectorRef local_1c8;
  undefined1 local_1b0 [8];
  ChVariablesBodyOwnMass mvarA;
  undefined1 local_d0 [8];
  ChMatrix33<double> minertia;
  ChSystemDescriptor local_78 [8];
  ChSystemDescriptor mdescriptor;
  string *out_dir_local;
  
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar1,"\n-------------------------------------------------\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"TEST: generic system with stiffness blocks \n\n");
  chrono::ChSystemDescriptor::ChSystemDescriptor(local_78);
  chrono::ChSystemDescriptor::BeginInsertion(local_78);
  chrono::ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_d0,6.0);
  chrono::ChVariablesBodyOwnMass::ChVariablesBodyOwnMass((ChVariablesBodyOwnMass *)local_1b0);
  chrono::ChVariablesBodyOwnMass::SetBodyMass(5.0);
  chrono::ChVariablesBodyOwnMass::SetBodyInertia((ChMatrix33 *)local_1b0);
  chrono::ChVariables::Get_fb(&local_1c8,(ChVariables *)local_1b0);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                *)&local_1c8,-3.0,5.0);
  chrono::ChVariablesBodyOwnMass::ChVariablesBodyOwnMass((ChVariablesBodyOwnMass *)local_2a8);
  chrono::ChVariablesBodyOwnMass::SetBodyMass(4.0);
  chrono::ChVariablesBodyOwnMass::SetBodyInertia((ChMatrix33 *)local_2a8);
  chrono::ChVariables::Get_fb(&local_2c0,(ChVariables *)local_2a8);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                *)&local_2c0,1.0,3.0);
  chrono::ChVariablesBodyOwnMass::ChVariablesBodyOwnMass((ChVariablesBodyOwnMass *)local_3a0);
  chrono::ChVariablesBodyOwnMass::SetBodyMass(5.5);
  chrono::ChVariablesBodyOwnMass::SetBodyInertia((ChMatrix33 *)local_3a0);
  chrono::ChVariables::Get_fb(&local_3b8,(ChVariables *)local_3a0);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                *)&local_3b8,-8.0,3.0);
  chrono::ChSystemDescriptor::InsertVariables(local_78,(ChVariables *)local_1b0);
  chrono::ChSystemDescriptor::InsertVariables(local_78,(ChVariables *)local_2a8);
  chrono::ChSystemDescriptor::InsertVariables(local_78,(ChVariables *)local_3a0);
  chrono::ChConstraintTwoBodies::ChConstraintTwoBodies
            (local_4d8,(ChVariablesBody *)local_1b0,(ChVariablesBody *)local_2a8);
  chrono::ChConstraint::Set_b_i((ChConstraint *)local_4d8,3.0);
  chrono::ChConstraintTwoBodies::Get_Cq_a(&local_4f8,local_4d8);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                *)&local_4f8,-1.0,1.0);
  chrono::ChConstraintTwoBodies::Get_Cq_b(&local_518,local_4d8);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                *)&local_518,-1.0,1.0);
  chrono::ChConstraint::Set_cfm_i((ChConstraint *)local_4d8,0.2);
  chrono::ChConstraintTwoBodies::ChConstraintTwoBodies
            (local_638,(ChVariablesBody *)local_1b0,(ChVariablesBody *)local_2a8);
  chrono::ChConstraint::Set_b_i((ChConstraint *)local_638,5.0);
  chrono::ChConstraintTwoBodies::Get_Cq_a(&local_658,local_638);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                *)&local_658,-1.0,1.0);
  chrono::ChConstraintTwoBodies::Get_Cq_b(&local_678,local_638);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                *)&local_678,-1.0,1.0);
  chrono::ChConstraint::Set_cfm_i((ChConstraint *)local_638,0.1);
  chrono::ChSystemDescriptor::InsertConstraint(local_78,(ChConstraint *)local_4d8);
  chrono::ChSystemDescriptor::InsertConstraint(local_78,(ChConstraint *)local_638);
  chrono::ChKblockGeneric::ChKblockGeneric
            ((ChKblockGeneric *)
             &mvarsa.
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_6c8);
  local_6d0 = (value_type)local_1b0;
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::push_back
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_6c8,
             &local_6d0);
  local_6d8 = (value_type)local_2a8;
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::push_back
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_6c8,
             &local_6d8);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)
             &mtempA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols,(vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)
                     local_6c8);
  chrono::ChKblockGeneric::SetVariables
            (&mvarsa.
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             &mtempA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)
             &mtempA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols);
  chrono::ChKblockGeneric::Get_K
            ((ChMatrixRef *)
             &mtempB.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols,(ChKblockGeneric *)
                     &mvarsa.
                      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::
  Matrix<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
            ((Matrix<double,_1,_1,1,_1,_1> *)local_708,
             (EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              *)&mtempB.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                 m_cols);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::fillRandom
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_708,-0.3,0.3);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_748,
             (Matrix<double,__1,__1,_1,__1,__1> *)local_708);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::operator-
            (&local_770,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_708);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const>>
  ::operator*(&local_760,
              (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>>
               *)&local_770,(MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_748);
  chrono::ChKblockGeneric::Get_K
            (&local_798,
             (ChKblockGeneric *)
             &mvarsa.
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::operator=
            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_798,
             (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
              *)&local_760);
  chrono::ChSystemDescriptor::InsertKblock
            (local_78,(ChKblock *)
                      &mvarsa.
                       super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  chrono::ChKblockGeneric::ChKblockGeneric
            ((ChKblockGeneric *)
             &mvarsb.
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_7e8);
  local_7f0 = (value_type)local_2a8;
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::push_back
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_7e8,
             &local_7f0);
  local_7f8 = (value_type)local_3a0;
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::push_back
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_7e8,
             &local_7f8);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            (&local_810,
             (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_7e8);
  chrono::ChKblockGeneric::SetVariables
            (&mvarsb.
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_810);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~vector(&local_810);
  chrono::ChKblockGeneric::Get_K
            (&local_838,
             (ChKblockGeneric *)
             &mvarsa.
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  chrono::ChKblockGeneric::Get_K
            (&local_860,
             (ChKblockGeneric *)
             &mvarsb.
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::operator=
            (&local_860,&local_838);
  chrono::ChSystemDescriptor::InsertKblock
            (local_78,(ChKblock *)
                      &mvarsb.
                       super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  chrono::ChSystemDescriptor::EndInsertion(local_78);
  chrono::ChSolverMINRES::ChSolverMINRES
            ((ChSolverMINRES *)
             &mx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  chrono::ChIterativeSolver::SetMaxIterations
            ((ChIterativeSolver *)
             &mx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,100
            );
  chrono::ChIterativeSolver::SetTolerance
            ((ChIterativeSolver *)
             &mx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             1e-12);
  chrono::ChIterativeSolver::EnableDiagonalPreconditioner
            ((ChIterativeSolver *)
             &mx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             true);
  chrono::ChSolver::SetVerbose(local_900,true);
  chrono::ChIterativeSolverLS::Setup
            ((ChSystemDescriptor *)
             &mx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  chrono::ChIterativeSolverLS::Solve
            ((ChSystemDescriptor *)
             &mx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_928);
  chrono::ChSystemDescriptor::FromUnknownsToVector((Matrix *)local_78,SUB81(local_928,0));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_928);
  chrono::ChSolverMINRES::~ChSolverMINRES
            ((ChSolverMINRES *)
             &mx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_7e8);
  chrono::ChKblockGeneric::~ChKblockGeneric
            ((ChKblockGeneric *)
             &mvarsb.
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_1,__1,__1> *)local_748);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_1,__1,__1> *)local_708);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_6c8);
  chrono::ChKblockGeneric::~ChKblockGeneric
            ((ChKblockGeneric *)
             &mvarsa.
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  chrono::ChConstraintTwoBodies::~ChConstraintTwoBodies(local_638);
  chrono::ChConstraintTwoBodies::~ChConstraintTwoBodies(local_4d8);
  chrono::ChVariablesBodyOwnMass::~ChVariablesBodyOwnMass((ChVariablesBodyOwnMass *)local_3a0);
  chrono::ChVariablesBodyOwnMass::~ChVariablesBodyOwnMass((ChVariablesBodyOwnMass *)local_2a8);
  chrono::ChVariablesBodyOwnMass::~ChVariablesBodyOwnMass((ChVariablesBodyOwnMass *)local_1b0);
  chrono::ChSystemDescriptor::~ChSystemDescriptor(local_78);
  return;
}

Assistant:

void test_3(const std::string& out_dir) {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: generic system with stiffness blocks \n\n";

    // Important: create a 'system descriptor' object that
    // contains variables and constraints:

    ChSystemDescriptor mdescriptor;

    // Now let's add variables, constraints and stiffness, as sparse data:

    mdescriptor.BeginInsertion();  // ----- system description

    // Create C++ objects representing 'variables', set their M blocks
    // (the masses) and set their known terms 'fb'

    ChMatrix33<> minertia(6);

    ChVariablesBodyOwnMass mvarA;
    mvarA.SetBodyMass(5);
    mvarA.SetBodyInertia(minertia);
    mvarA.Get_fb().fillRandom(-3, 5);

    ChVariablesBodyOwnMass mvarB;
    mvarB.SetBodyMass(4);
    mvarB.SetBodyInertia(minertia);
    mvarB.Get_fb().fillRandom(1, 3);

    ChVariablesBodyOwnMass mvarC;
    mvarC.SetBodyMass(5.5);
    mvarC.SetBodyInertia(minertia);
    mvarC.Get_fb().fillRandom(-8, 3);

    ////ChMatrixDynamic<> foo(3, 4);
    ////foo.fillRandom(0, 10);
    ////std::cout << "foo....\n" << foo << std::endl;
    ////return;

    mdescriptor.InsertVariables(&mvarA);
    mdescriptor.InsertVariables(&mvarB);
    mdescriptor.InsertVariables(&mvarC);

    // Create two C++ objects representing 'constraints' between variables
    // and set the jacobian to random values;
    // Also set cfm term (E diagonal = -cfm)

    ChConstraintTwoBodies mca(&mvarA, &mvarB);
    mca.Set_b_i(3);
    mca.Get_Cq_a().fillRandom(-1, 1);
    mca.Get_Cq_b().fillRandom(-1, 1);
    mca.Set_cfm_i(0.2);

    ChConstraintTwoBodies mcb(&mvarA, &mvarB);
    mcb.Set_b_i(5);
    mcb.Get_Cq_a().fillRandom(-1, 1);
    mcb.Get_Cq_b().fillRandom(-1, 1);
    mcb.Set_cfm_i(0.1);

    mdescriptor.InsertConstraint(&mca);
    mdescriptor.InsertConstraint(&mcb);

    // Create two C++ objects representing 'stiffness' between variables:

    ChKblockGeneric mKa;
    // set the affected variables (so this K is a 12x12 matrix, relative to 4 6x6 blocks)
    std::vector<ChVariables*> mvarsa;
    mvarsa.push_back(&mvarA);
    mvarsa.push_back(&mvarB);
    mKa.SetVariables(mvarsa);

    // just fill K with random values (but symmetric, by making a product of matr*matrtransposed)
    ChMatrixDynamic<> mtempA = mKa.Get_K();
    mtempA.fillRandom(-0.3, 0.3);
    ChMatrixDynamic<> mtempB(mtempA);
    mKa.Get_K() = -mtempA * mtempB;

    mdescriptor.InsertKblock(&mKa);

    ChKblockGeneric mKb;
    // set the affected variables (so this K is a 12x12 matrix, relative to 4 6x6 blocks)
    std::vector<ChVariables*> mvarsb;
    mvarsb.push_back(&mvarB);
    mvarsb.push_back(&mvarC);
    mKb.SetVariables(mvarsb);

    mKb.Get_K() = mKa.Get_K();

    mdescriptor.InsertKblock(&mKb);

    mdescriptor.EndInsertion();  // ----- system description ends here

    // Create the solver (MINRES) ...
    ChSolverMINRES solver;
    solver.SetMaxIterations(100);
    solver.SetTolerance(1e-12);
    solver.EnableDiagonalPreconditioner(true);
    solver.SetVerbose(true);

    // .. solve the system (passing variables, constraints, stiffness
    //    blocks with the ChSystemDescriptor that we populated above)
    solver.Setup(mdescriptor);
    solver.Solve(mdescriptor);

    // .. optional: get the result as a single vector (it collects all q_i and l_i
    //    solved values stored in variables and constraints), just for check.
    chrono::ChVectorDynamic<double> mx;
    mdescriptor.FromUnknownsToVector(mx);  // x ={q,-l}

    /*
    // Alternatively, instead of using FromUnknownsToVector, to fetch
    // result, you could just loop over the variables (q values) and
    // over the constraints (l values), as already shown in previous examples:

    for (int im = 0; im < mdescriptor.GetVariablesList().size(); im++)
        GetLog() << "   " << mdescriptor.GetVariablesList()[im]->Get_qb()(0) << "\n";

    for (int ic = 0; ic < mdescriptor.GetConstraintsList().size(); ic++)
        GetLog() << "   " << mdescriptor.GetConstraintsList()[ic]->Get_l_i() << "\n";
    */
}